

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::UninterpretedOption::MergePartialFromCodedStream
          (UninterpretedOption *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  double *pdVar4;
  uint8 *puVar5;
  bool bVar6;
  uint32 uVar7;
  int byte_limit;
  Type *this_02;
  unsigned_long uVar8;
  pair<int,_int> pVar9;
  UnknownFieldSet *unknown_fields;
  char cVar10;
  uint tag;
  ulong uVar11;
  string *psVar12;
  double dVar13;
  pair<unsigned_long,_bool> pVar14;
  double local_38;
  
  this_00 = &this->aggregate_value_;
  this_01 = &this->identifier_value_;
LAB_001fea35:
  pbVar2 = input->buffer_;
  uVar7 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar7 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_001fea58;
    input->buffer_ = pbVar2 + 1;
    uVar11 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_001fea58:
    uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar11 = 0;
    if (uVar7 - 1 < 0x7f) {
      uVar11 = 0x100000000;
    }
    uVar11 = uVar7 | uVar11;
  }
  tag = (uint)uVar11;
  if ((uVar11 & 0x100000000) == 0) goto switchD_001fead0_default;
  cVar10 = (char)uVar11;
  switch((uint)(uVar11 >> 3) & 0x1fffffff) {
  case 2:
    if (cVar10 == '\x12') {
      this_02 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                          (&(this->name_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (byte_limit = (int)(char)*puVar5, -1 < byte_limit)) {
        input->buffer_ = puVar5 + 1;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar6 = UninterpretedOption_NamePart::MergePartialFromCodedStream(this_02,input);
      if (!bVar6) {
        return false;
      }
      bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar9.first);
      if (!bVar6) {
        return false;
      }
      goto LAB_001fea35;
    }
    break;
  case 3:
    if (cVar10 == '\x1a') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar12 = (this->identifier_value_).ptr_;
      if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_01,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar12 = this_01->ptr_;
      }
      bVar6 = internal::WireFormatLite::ReadBytes(input,psVar12);
      if (!bVar6) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,PARSE,
                 "google.protobuf.UninterpretedOption.identifier_value");
      goto LAB_001fea35;
    }
    break;
  case 4:
    if (cVar10 != ' ') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (-1 < (long)(char)*puVar5)) {
      this->positive_int_value_ = (long)(char)*puVar5;
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar14 = io::CodedInputStream::ReadVarint64Fallback(input);
      this->positive_int_value_ = pVar14.first;
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    goto LAB_001fea35;
  case 5:
    if (cVar10 == '(') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar8 = (unsigned_long)(char)*puVar5, -1 < (long)uVar8))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar14 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar8 = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->negative_int_value_ = uVar8;
      goto LAB_001fea35;
    }
    break;
  case 6:
    if (cVar10 == '1') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      pdVar4 = (double *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
        bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_38);
        dVar13 = local_38;
        if (!bVar6) {
          return false;
        }
      }
      else {
        dVar13 = *pdVar4;
        input->buffer_ = (uint8 *)(pdVar4 + 1);
      }
      this->double_value_ = dVar13;
      goto LAB_001fea35;
    }
    break;
  case 7:
    if (cVar10 != ':') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
    psVar12 = (this->string_value_).ptr_;
    if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->string_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar12 = (this->string_value_).ptr_;
    }
    bVar6 = internal::WireFormatLite::ReadBytes(input,psVar12);
    goto LAB_001feaac;
  case 8:
    if (cVar10 == 'B') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      psVar12 = (this->aggregate_value_).ptr_;
      if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar12 = this_00->ptr_;
      }
      bVar6 = internal::WireFormatLite::ReadBytes(input,psVar12);
      if (!bVar6) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                 "google.protobuf.UninterpretedOption.aggregate_value");
      goto LAB_001fea35;
    }
  }
switchD_001fead0_default:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    unknown_fields =
         internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  bVar6 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_001feaac:
  if (bVar6 == false) {
    return false;
  }
  goto LAB_001fea35;
}

Assistant:

bool UninterpretedOption::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.UninterpretedOption)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_name()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string identifier_value = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_identifier_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->identifier_value().data(), this->identifier_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.UninterpretedOption.identifier_value");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint64 positive_int_value = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_positive_int_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &positive_int_value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int64 negative_int_value = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_negative_int_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &negative_int_value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional double double_value = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(49u)) {
          set_has_double_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &double_value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bytes string_value = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_string_value()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string aggregate_value = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_aggregate_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->aggregate_value().data(), this->aggregate_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.UninterpretedOption.aggregate_value");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.UninterpretedOption)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.UninterpretedOption)
  return false;
#undef DO_
}